

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrcmp.h
# Opt level: O2

void __thiscall
CVmObjStrComp::count_equiv_mappings(CVmObjStrComp *this,size_t *equiv_cnt,size_t *total_value_ch)

{
  char *pcVar1;
  long lVar2;
  long *plVar3;
  long lVar4;
  long lVar5;
  
  pcVar1 = (this->super_CVmObject).ext_;
  *total_value_ch = 0;
  *equiv_cnt = 0;
  plVar3 = (long *)(pcVar1 + 0x10);
  for (lVar4 = 0; lVar4 != 0x100; lVar4 = lVar4 + 1) {
    lVar2 = *plVar3;
    if (lVar2 != 0) {
      for (lVar5 = 0; lVar5 != 0x100; lVar5 = lVar5 + 1) {
        if (*(long *)(lVar2 + lVar5 * 8) != 0) {
          *equiv_cnt = *equiv_cnt + 1;
          *total_value_ch = *total_value_ch + **(long **)(lVar2 + lVar5 * 8);
        }
      }
    }
    plVar3 = plVar3 + 1;
  }
  return;
}

Assistant:

vmobj_strcmp_ext *get_ext() const { return (vmobj_strcmp_ext *)ext_; }